

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O1

void * daemon_conn_thread(void *_sock_fd)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  void *pvVar4;
  int iVar5;
  int *piVar6;
  void *pvVar7;
  EC_KEY **ppEVar8;
  EVP_PKEY *pEVar9;
  rsa_st *r;
  size_t sVar10;
  size_t sVar11;
  EC_KEY *pEVar12;
  RSA *pRVar13;
  EC_POINT *pEVar14;
  BIGNUM *pBVar15;
  BIGNUM *pBVar16;
  undefined8 uVar17;
  ulong *puVar18;
  long lVar19;
  code *func;
  char *pcVar20;
  char *pcVar21;
  ulong uVar22;
  ulong uVar23;
  anon_struct_112_2_e855199f *paVar24;
  uchar *__s;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  BIGNUM *e;
  uchar auth_token [32];
  char errbuf [256];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  char *local_10b0;
  uchar *local_10a8;
  char *local_10a0;
  uint local_1098;
  undefined4 uStack_1094;
  void *local_1090;
  BIGNUM *local_1088;
  RSA *local_1080;
  EVP_PKEY *local_1078;
  FILE *local_1070;
  ulong *local_1068;
  BIGNUM *local_1060;
  uchar local_1058;
  uchar uStack_1057;
  uchar uStack_1056;
  uchar uStack_1055;
  uchar uStack_1054;
  uchar uStack_1053;
  uchar uStack_1052;
  uchar uStack_1051;
  uchar uStack_1050;
  uchar uStack_104f;
  uchar uStack_104e;
  uchar uStack_104d;
  uchar uStack_104c;
  uchar uStack_104b;
  uchar uStack_104a;
  uchar uStack_1049;
  uchar local_1048;
  uchar uStack_1047;
  uchar uStack_1046;
  uchar uStack_1045;
  uchar uStack_1044;
  uchar uStack_1043;
  uchar uStack_1042;
  uchar uStack_1041;
  uchar uStack_1040;
  uchar uStack_103f;
  uchar uStack_103e;
  uchar uStack_103d;
  uchar uStack_103c;
  uchar uStack_103b;
  uchar uStack_103a;
  uchar uStack_1039;
  uchar local_1038 [24];
  undefined5 uStack_1020;
  undefined3 local_101b;
  undefined5 uStack_1018;
  char acStack_1013 [4067];
  
  local_10c8 = (undefined1  [16])0x0;
  local_10d8._0_8_ = (char *)0x0;
  local_10d8._8_8_ = (ulong *)0x0;
  iVar5 = read_nbytes((int)_sock_fd,&local_1058,0x20);
  if (iVar5 == 0) {
    auVar26[0] = -((daemon_vars.nb)->auth_token[0x10] == local_1048);
    auVar26[1] = -((daemon_vars.nb)->auth_token[0x11] == uStack_1047);
    auVar26[2] = -((daemon_vars.nb)->auth_token[0x12] == uStack_1046);
    auVar26[3] = -((daemon_vars.nb)->auth_token[0x13] == uStack_1045);
    auVar26[4] = -((daemon_vars.nb)->auth_token[0x14] == uStack_1044);
    auVar26[5] = -((daemon_vars.nb)->auth_token[0x15] == uStack_1043);
    auVar26[6] = -((daemon_vars.nb)->auth_token[0x16] == uStack_1042);
    auVar26[7] = -((daemon_vars.nb)->auth_token[0x17] == uStack_1041);
    auVar26[8] = -((daemon_vars.nb)->auth_token[0x18] == uStack_1040);
    auVar26[9] = -((daemon_vars.nb)->auth_token[0x19] == uStack_103f);
    auVar26[10] = -((daemon_vars.nb)->auth_token[0x1a] == uStack_103e);
    auVar26[0xb] = -((daemon_vars.nb)->auth_token[0x1b] == uStack_103d);
    auVar26[0xc] = -((daemon_vars.nb)->auth_token[0x1c] == uStack_103c);
    auVar26[0xd] = -((daemon_vars.nb)->auth_token[0x1d] == uStack_103b);
    auVar26[0xe] = -((daemon_vars.nb)->auth_token[0x1e] == uStack_103a);
    auVar26[0xf] = -((daemon_vars.nb)->auth_token[0x1f] == uStack_1039);
    auVar25[0] = -((daemon_vars.nb)->auth_token[0] == local_1058);
    auVar25[1] = -((daemon_vars.nb)->auth_token[1] == uStack_1057);
    auVar25[2] = -((daemon_vars.nb)->auth_token[2] == uStack_1056);
    auVar25[3] = -((daemon_vars.nb)->auth_token[3] == uStack_1055);
    auVar25[4] = -((daemon_vars.nb)->auth_token[4] == uStack_1054);
    auVar25[5] = -((daemon_vars.nb)->auth_token[5] == uStack_1053);
    auVar25[6] = -((daemon_vars.nb)->auth_token[6] == uStack_1052);
    auVar25[7] = -((daemon_vars.nb)->auth_token[7] == uStack_1051);
    auVar25[8] = -((daemon_vars.nb)->auth_token[8] == uStack_1050);
    auVar25[9] = -((daemon_vars.nb)->auth_token[9] == uStack_104f);
    auVar25[10] = -((daemon_vars.nb)->auth_token[10] == uStack_104e);
    auVar25[0xb] = -((daemon_vars.nb)->auth_token[0xb] == uStack_104d);
    auVar25[0xc] = -((daemon_vars.nb)->auth_token[0xc] == uStack_104c);
    auVar25[0xd] = -((daemon_vars.nb)->auth_token[0xd] == uStack_104b);
    auVar25[0xe] = -((daemon_vars.nb)->auth_token[0xe] == uStack_104a);
    auVar25[0xf] = -((daemon_vars.nb)->auth_token[0xf] == uStack_1049);
    auVar25 = auVar25 & auVar26;
    if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
      iVar5 = expbuf_read((expbuf_t *)local_10d8,(int)_sock_fd);
      pvVar4 = _sock_fd;
      pvVar7 = local_1090;
      puVar18 = (ulong *)local_10d8._8_8_;
      while (local_1090 = pvVar4, local_10d8._8_8_ = puVar18, iVar5 == 0) {
        pcVar21 = "priv_enc";
        uVar17 = local_10c8._0_8_;
        pvVar7 = memchr(puVar18,0,local_10c8._0_8_ - (long)puVar18);
        if (pvVar7 == (void *)0x0) {
          puVar18 = (ulong *)0x0;
        }
        else {
          local_10d8._8_8_ = (long)pvVar7 + 1;
        }
        if (puVar18 == (ulong *)0x0) {
          piVar6 = __errno_location();
          *piVar6 = 0;
          pcVar21 = "failed to parse request";
          goto LAB_0018ca2a;
        }
        iVar5 = strcmp((char *)puVar18,"priv_enc");
        if (iVar5 == 0) {
          pcVar21 = "priv_enc_stub";
          func = RSA_private_encrypt;
LAB_0018bfe8:
          iVar5 = priv_encdec_stub(pcVar21,func,(expbuf_t *)local_10d8);
LAB_0018bff0:
          if (iVar5 != 0) goto LAB_0018ca31;
        }
        else {
          iVar5 = strcmp((char *)puVar18,"priv_dec");
          if (iVar5 == 0) {
            pcVar21 = "priv_dec_stub";
            func = RSA_private_decrypt;
            goto LAB_0018bfe8;
          }
          iVar5 = strcmp((char *)puVar18,"sign");
          if (iVar5 == 0) {
            local_1098 = 0;
            if (7 < (ulong)(uVar17 - local_10d8._8_8_)) {
              iVar5 = *(int *)local_10d8._8_8_;
              puVar18 = (ulong *)(local_10d8._8_8_ + 8);
              if ((ulong)(uVar17 - (long)puVar18) < 8) {
LAB_0018c0d2:
                local_10d8._8_8_ = puVar18;
                puVar18 = (ulong *)0x0;
              }
              else {
                pcVar21 = (char *)*puVar18;
                puVar18 = (ulong *)(local_10d8._8_8_ + 0x10);
                if ((char *)(uVar17 + -(long)puVar18) < pcVar21) goto LAB_0018c0d2;
                local_10d8._8_8_ = (long)puVar18 + (long)pcVar21;
              }
              if ((puVar18 != (ulong *)0x0) && (7 < (ulong)(uVar17 - local_10d8._8_8_))) {
                uVar22 = *(ulong *)local_10d8._8_8_;
                local_10d8._8_8_ = local_10d8._8_8_ + 8;
                pRVar13 = (RSA *)daemon_get_rsa(uVar22);
                if (pRVar13 != (RSA *)0x0) {
                  iVar5 = RSA_sign(iVar5,(uchar *)puVar18,(uint)pcVar21,local_1038,&local_1098,
                                   pRVar13);
                  expbuf_dispose((expbuf_t *)local_10d8);
                  RSA_free(pRVar13);
LAB_0018c28d:
                  expbuf_reserve((expbuf_t *)local_10d8,8);
                  *(long *)local_10c8._0_8_ = (long)iVar5;
                  local_10c8._0_8_ = (long *)(local_10c8._0_8_ + 8);
                  uVar2 = local_1098;
                  if (iVar5 != 1) {
                    uVar2 = 0;
                  }
                  expbuf_push_bytes((expbuf_t *)local_10d8,local_1038,(ulong)uVar2);
                  _sock_fd = local_1090;
                  goto LAB_0018c7a1;
                }
                piVar6 = __errno_location();
                *piVar6 = 0;
                pcVar21 = "sign_stub";
LAB_0018cb07:
                warnf("%s: invalid key index:%zu",pcVar21,uVar22);
                _sock_fd = local_1090;
                goto LAB_0018ca31;
              }
            }
            piVar6 = __errno_location();
            *piVar6 = 0;
            pcVar21 = "sign_stub";
LAB_0018cab8:
            warnf("%s: failed to parse request",pcVar21);
            _sock_fd = local_1090;
            goto LAB_0018ca31;
          }
          iVar5 = strcmp((char *)puVar18,"ecdsa_sign");
          if (iVar5 == 0) {
            local_1098 = 0;
            if (7 < (ulong)(uVar17 - local_10d8._8_8_)) {
              local_10b0 = (char *)CONCAT44(local_10b0._4_4_,*(int *)local_10d8._8_8_);
              puVar18 = (ulong *)(local_10d8._8_8_ + 8);
              if ((ulong)(uVar17 - (long)puVar18) < 8) {
LAB_0018c1f3:
                local_10d8._8_8_ = puVar18;
                puVar18 = (ulong *)0x0;
              }
              else {
                pcVar21 = (char *)*puVar18;
                puVar18 = (ulong *)(local_10d8._8_8_ + 0x10);
                if ((char *)(uVar17 + -(long)puVar18) < pcVar21) goto LAB_0018c1f3;
                local_10d8._8_8_ = (long)puVar18 + (long)pcVar21;
              }
              if ((puVar18 != (ulong *)0x0) && (7 < (ulong)(uVar17 - local_10d8._8_8_))) {
                uVar22 = *(ulong *)local_10d8._8_8_;
                local_10d8._8_8_ = local_10d8._8_8_ + 8;
                pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                pEVar12 = (EC_KEY *)daemon_vars.keys.ecdsa_keys[uVar22];
                if (pEVar12 == (EC_KEY *)0x0) {
                  pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                  piVar6 = __errno_location();
                  *piVar6 = 0;
                  pcVar21 = "ecdsa_sign_stub";
                  goto LAB_0018cb07;
                }
                EC_KEY_up_ref(pEVar12);
                pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                iVar5 = ECDSA_sign((int)local_10b0,(uchar *)puVar18,(int)pcVar21,local_1038,
                                   &local_1098,pEVar12);
                expbuf_dispose((expbuf_t *)local_10d8);
                EC_KEY_free(pEVar12);
                goto LAB_0018c28d;
              }
            }
            piVar6 = __errno_location();
            *piVar6 = 0;
            pcVar21 = "ecdsa_sign_stub";
            goto LAB_0018cab8;
          }
          iVar5 = strcmp((char *)puVar18,"del_ecdsa_key");
          if (iVar5 != 0) {
            iVar5 = strcmp((char *)puVar18,"load_key");
            if (iVar5 == 0) {
              memset(local_1038,0,0x100);
              puVar18 = (ulong *)local_10d8._8_8_;
              pvVar7 = memchr((void *)local_10d8._8_8_,0,uVar17 - local_10d8._8_8_);
              if (pvVar7 == (void *)0x0) {
                puVar18 = (ulong *)0x0;
              }
              else {
                local_10d8._8_8_ = (long)pvVar7 + 1;
              }
              if (puVar18 == (ulong *)0x0) {
                warnf("%s: failed to parse request","load_key_stub");
              }
              else {
                local_1070 = fopen((char *)puVar18,"rt");
                paVar24 = (anon_struct_112_2_e855199f *)pcVar21;
                local_1068 = puVar18;
                if (local_1070 == (FILE *)0x0) {
                  piVar6 = __errno_location();
                  strerror_r(*piVar6,(char *)local_1038,0x100);
LAB_0018c560:
                  sVar10 = 0xffffffffffffffff;
                  r = (rsa_st *)0x0;
                  local_10b0 = (char *)0x0;
                  local_10a0 = (char *)0x0;
                  lVar19 = 0;
                  local_1078 = (EVP_PKEY *)0x0;
LAB_0018c587:
                  local_1088 = (BIGNUM *)0x0;
                  local_10a8 = (uchar *)0x0;
                }
                else {
                  pEVar9 = PEM_read_PrivateKey(local_1070,(EVP_PKEY **)0x0,(undefined1 *)0x0,
                                               (void *)0x0);
                  if (pEVar9 == (EVP_PKEY *)0x0) {
                    builtin_memcpy(local_1038 + 0x10,"the priv",8);
                    uStack_1020 = 0x6b20657461;
                    local_101b = 0x7965;
                    builtin_memcpy(local_1038,"failed to parse ",0x10);
                    goto LAB_0018c560;
                  }
                  iVar5 = EVP_PKEY_get_base_id(pEVar9);
                  local_1078 = pEVar9;
                  if (iVar5 != 0x198) {
                    if (iVar5 == 6) {
                      r = EVP_PKEY_get1_RSA(pEVar9);
                      paVar24 = &daemon_vars;
                      pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                      adjust_slots_reserved_size(1,&daemon_vars.keys.rsa_slots);
                      puVar3 = daemon_vars.keys.rsa_slots.bita_avail;
                      sVar10 = bita_ffirst(daemon_vars.keys.rsa_slots.bita_avail,
                                           daemon_vars.keys.rsa_slots.reserved_size,0);
                      if (sVar10 == 0xffffffffffffffff) goto LAB_0018cb2e;
                      bVar1 = (byte)sVar10 & 7;
                      puVar3[sVar10 >> 3] = puVar3[sVar10 >> 3] & (-2 << bVar1 | 0xfeU >> 8 - bVar1)
                      ;
                      daemon_vars.keys.rsa_slots.size = daemon_vars.keys.rsa_slots.size + 1;
                      daemon_vars.keys.keys[sVar10] = (RSA *)r;
                      RSA_up_ref(r);
                      pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                      RSA_get0_key(r,&local_1060,&local_1098);
                      local_10b0 = BN_bn2hex((BIGNUM *)CONCAT44(uStack_1094,local_1098));
                      local_10a0 = BN_bn2hex(local_1060);
                      lVar19 = 1;
                    }
                    else {
                      EVP_PKEY_get_base_id();
                      snprintf((char *)local_1038,0x100,"unsupported private key: %d");
                      sVar10 = 0xffffffffffffffff;
                      r = (rsa_st *)0x0;
                      local_10b0 = (char *)0x0;
                      local_10a0 = (char *)0x0;
                      lVar19 = 0;
                    }
                    goto LAB_0018c587;
                  }
                  pEVar12 = (EC_KEY *)EVP_PKEY_get0_EC_KEY();
                  pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                  adjust_slots_reserved_size(2,&daemon_vars.keys.ecdsa_slots);
                  puVar3 = daemon_vars.keys.ecdsa_slots.bita_avail;
                  sVar10 = bita_ffirst(daemon_vars.keys.ecdsa_slots.bita_avail,
                                       daemon_vars.keys.ecdsa_slots.reserved_size,0);
                  if (sVar10 == 0xffffffffffffffff) {
LAB_0018cb2e:
                    dief("no available slot for key");
                  }
                  bVar1 = (byte)sVar10 & 7;
                  puVar3[sVar10 >> 3] = puVar3[sVar10 >> 3] & (-2 << bVar1 | 0xfeU >> 8 - bVar1);
                  daemon_vars.keys.ecdsa_slots.size = daemon_vars.keys.ecdsa_slots.size + 1;
                  daemon_vars.keys.ecdsa_keys[sVar10] = (EC_KEY *)pEVar12;
                  EC_KEY_up_ref(pEVar12);
                  pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                  pRVar13 = (RSA *)EC_KEY_get0_group(pEVar12);
                  pEVar14 = EC_KEY_get0_public_key(pEVar12);
                  pBVar15 = BN_new();
                  local_1080 = pRVar13;
                  pBVar16 = EC_POINT_point2bn((EC_GROUP *)pRVar13,pEVar14,
                                              POINT_CONVERSION_COMPRESSED,pBVar15,(BN_CTX *)0x0);
                  local_1088 = pBVar15;
                  if (pBVar16 == (BIGNUM *)0x0) {
                    uStack_1018 = 0x6f74207965;
                    builtin_strncpy(acStack_1013," BIGNUM",8);
                    builtin_memcpy(local_1038 + 0x10,"t ECDSA ",8);
                    uStack_1020 = 0x696c627570;
                    local_101b = 0x6b2063;
                    builtin_memcpy(local_1038,"failed to conver",0x10);
                    lVar19 = 0;
                    local_10a8 = (uchar *)0x0;
                  }
                  else {
                    local_10a8 = (uchar *)BN_bn2hex(pBVar15);
                    lVar19 = 2;
                  }
                  local_10a0 = (char *)0x0;
                  local_10b0 = (char *)0x0;
                  r = (rsa_st *)0x0;
                  paVar24 = (anon_struct_112_2_e855199f *)local_1080;
                }
                expbuf_dispose((expbuf_t *)local_10d8);
                expbuf_reserve((expbuf_t *)local_10d8,8);
                *(long *)local_10c8._0_8_ = lVar19;
                local_10c8._0_8_ = (size_t *)(local_10c8._0_8_ + 8);
                expbuf_reserve((expbuf_t *)local_10d8,8);
                *(size_t *)local_10c8._0_8_ = sVar10;
                local_10c8._0_8_ = local_10c8._0_8_ + 8;
                local_1080 = r;
                if (lVar19 == 2) {
                  iVar5 = EC_GROUP_get_curve_name((EC_GROUP *)paVar24);
                  expbuf_reserve((expbuf_t *)local_10d8,8);
                  *(long *)local_10c8._0_8_ = (long)iVar5;
                  local_10c8._0_8_ = local_10c8._0_8_ + 8;
                  __s = local_10a8;
LAB_0018c6c0:
                  sVar11 = strlen((char *)__s);
                  expbuf_reserve((expbuf_t *)local_10d8,sVar11 + 1);
                  uVar17 = local_10c8._0_8_;
                  memcpy((void *)local_10c8._0_8_,__s,sVar11 + 1);
                  pcVar21 = (char *)(uVar17 + sVar11);
                }
                else {
                  if ((int)lVar19 != 1) {
                    __s = local_1038;
                    goto LAB_0018c6c0;
                  }
                  pcVar21 = local_10b0;
                  if (local_10b0 == (char *)0x0) {
                    pcVar21 = "";
                  }
                  sVar11 = strlen(pcVar21);
                  expbuf_reserve((expbuf_t *)local_10d8,sVar11 + 1);
                  uVar17 = local_10c8._0_8_;
                  memcpy((void *)local_10c8._0_8_,pcVar21,sVar11 + 1);
                  local_10c8._0_8_ = uVar17 + sVar11 + 1;
                  pcVar21 = local_10a0;
                  if (local_10a0 == (char *)0x0) {
                    pcVar21 = "";
                  }
                  sVar11 = strlen(pcVar21);
                  expbuf_reserve((expbuf_t *)local_10d8,sVar11 + 1);
                  uVar17 = local_10c8._0_8_;
                  memcpy((void *)local_10c8._0_8_,pcVar21,sVar11 + 1);
                  pcVar21 = (char *)(uVar17 + sVar11);
                  _sock_fd = local_1090;
                }
                puVar18 = local_1068;
                pEVar9 = local_1078;
                pBVar15 = local_1088;
                local_10c8._0_8_ = pcVar21 + 1;
                if (local_1080 != (RSA *)0x0) {
                  RSA_free(local_1080);
                }
                if (pEVar9 != (EVP_PKEY *)0x0) {
                  EVP_PKEY_free(pEVar9);
                }
                if (local_10b0 != (char *)0x0) {
                  CRYPTO_free(local_10b0);
                }
                if (local_10a0 != (char *)0x0) {
                  CRYPTO_free(local_10a0);
                }
                if (local_10a8 != (uchar *)0x0) {
                  CRYPTO_free(local_10a8);
                }
                if (pBVar15 != (BIGNUM *)0x0) {
                  BN_free(pBVar15);
                }
                if (local_1070 != (FILE *)0x0) {
                  fclose(local_1070);
                }
              }
              if (puVar18 != (ulong *)0x0) goto LAB_0018c7a1;
            }
            else {
              iVar5 = strcmp((char *)puVar18,"del_rsa_key");
              if (iVar5 == 0) {
                uVar22 = uVar17 - local_10d8._8_8_;
                if (uVar22 < 8) {
                  piVar6 = __errno_location();
                  *piVar6 = 0;
                  pcVar21 = "del_rsa_key_stub";
                  goto LAB_0018c9db;
                }
                uVar23 = *(ulong *)local_10d8._8_8_;
                local_10d8._8_8_ = local_10d8._8_8_ + 8;
                if ((daemon_vars.keys.keys == (RSA **)0x0) ||
                   (daemon_vars.keys.rsa_slots.reserved_size <= uVar23)) {
                  piVar6 = __errno_location();
                  *piVar6 = 0;
                  pcVar21 = "%s: invalid key index %zu";
                }
                else {
                  if ((daemon_vars.keys.rsa_slots.bita_avail[uVar23 >> 3] >> ((uint)uVar23 & 7) & 1)
                      == 0) {
                    pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                    daemon_vars.keys.rsa_slots.bita_avail[uVar23 >> 3] =
                         daemon_vars.keys.rsa_slots.bita_avail[uVar23 >> 3] |
                         '\x01' << ((byte)uVar23 & 7);
                    daemon_vars.keys.rsa_slots.size = daemon_vars.keys.rsa_slots.size - 1;
                    RSA_free((RSA *)daemon_vars.keys.keys[uVar23]);
                    ppEVar8 = (EC_KEY **)daemon_vars.keys.keys;
                    goto LAB_0018c3b3;
                  }
                  pcVar21 = "%s: index not in use %zu";
                }
                pcVar20 = "del_rsa_key_stub";
                goto LAB_0018ca09;
              }
              iVar5 = strcmp((char *)puVar18,"setuidgid");
              if (iVar5 == 0) {
                iVar5 = setuidgid_stub((expbuf_t *)local_10d8);
                goto LAB_0018bff0;
              }
              warnf("unknown command:%s",puVar18);
            }
            goto LAB_0018ca31;
          }
          uVar22 = uVar17 - local_10d8._8_8_;
          if (uVar22 < 8) {
            piVar6 = __errno_location();
            *piVar6 = 0;
            pcVar21 = "del_ecdsa_key_stub";
LAB_0018c9db:
            warnf("%s: failed to parse request",pcVar21);
          }
          else {
            uVar23 = *(ulong *)local_10d8._8_8_;
            local_10d8._8_8_ = local_10d8._8_8_ + 8;
            if ((daemon_vars.keys.ecdsa_keys == (EC_KEY **)0x0) ||
               (daemon_vars.keys.ecdsa_slots.reserved_size <= uVar23)) {
              piVar6 = __errno_location();
              *piVar6 = 0;
              pcVar21 = "%s: invalid key index %zu";
LAB_0018c943:
              pcVar20 = "del_ecdsa_key_stub";
LAB_0018ca09:
              warnf(pcVar21,pcVar20,uVar23);
              uVar17 = 0;
            }
            else {
              if ((daemon_vars.keys.ecdsa_slots.bita_avail[uVar23 >> 3] >> ((uint)uVar23 & 7) & 1)
                  != 0) {
                pcVar21 = "%s: index not in use %zu";
                goto LAB_0018c943;
              }
              pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
              daemon_vars.keys.ecdsa_slots.bita_avail[uVar23 >> 3] =
                   daemon_vars.keys.ecdsa_slots.bita_avail[uVar23 >> 3] |
                   '\x01' << ((byte)uVar23 & 7);
              daemon_vars.keys.ecdsa_slots.size = daemon_vars.keys.ecdsa_slots.size - 1;
              EC_KEY_free((EC_KEY *)daemon_vars.keys.ecdsa_keys[uVar23]);
              ppEVar8 = daemon_vars.keys.ecdsa_keys;
LAB_0018c3b3:
              ((RSA **)ppEVar8)[uVar23] = (RSA *)0x0;
              pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
              uVar17 = 1;
            }
            expbuf_dispose((expbuf_t *)local_10d8);
            expbuf_reserve((expbuf_t *)local_10d8,8);
            *(undefined8 *)local_10c8._0_8_ = uVar17;
            local_10c8._0_8_ = (char *)(local_10c8._0_8_ + 8);
          }
          if (uVar22 < 8) goto LAB_0018ca31;
        }
LAB_0018c7a1:
        iVar5 = expbuf_write((expbuf_t *)local_10d8,(int)_sock_fd);
        if (iVar5 != 0) {
          piVar6 = __errno_location();
          pcVar21 = "write error";
          if (*piVar6 == 0) {
            pcVar21 = "connection closed by client";
          }
          goto LAB_0018ca2a;
        }
        expbuf_dispose((expbuf_t *)local_10d8);
        iVar5 = expbuf_read((expbuf_t *)local_10d8,(int)_sock_fd);
        pvVar4 = local_1090;
        pvVar7 = local_1090;
        puVar18 = (ulong *)local_10d8._8_8_;
      }
      local_1090 = pvVar7;
      piVar6 = __errno_location();
      if (*piVar6 == 0) goto LAB_0018ca31;
      pcVar21 = "read error";
    }
    else {
      pcVar21 = "client authentication failed";
    }
  }
  else {
    pcVar21 = "failed to receive authencication token from client";
  }
LAB_0018ca2a:
  warnf(pcVar21);
LAB_0018ca31:
  expbuf_dispose((expbuf_t *)local_10d8);
  close((int)_sock_fd);
  return (void *)0x0;
}

Assistant:

static void *daemon_conn_thread(void *_sock_fd)
{
    int sock_fd = (int)((char *)_sock_fd - (char *)NULL);
    struct expbuf_t buf = {NULL};
    unsigned char auth_token[NEVERBLEED_AUTH_TOKEN_SIZE];

    /* authenticate */
    if (read_nbytes(sock_fd, &auth_token, sizeof(auth_token)) != 0) {
        warnf("failed to receive authencication token from client");
        goto Exit;
    }
    if (memcmp(auth_token, daemon_vars.nb->auth_token, NEVERBLEED_AUTH_TOKEN_SIZE) != 0) {
        warnf("client authentication failed");
        goto Exit;
    }

    while (1) {
        char *cmd;
        if (expbuf_read(&buf, sock_fd) != 0) {
            if (errno != 0)
                warnf("read error");
            break;
        }
        if ((cmd = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            warnf("failed to parse request");
            break;
        }
        if (strcmp(cmd, "priv_enc") == 0) {
            if (priv_enc_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "priv_dec") == 0) {
            if (priv_dec_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "sign") == 0) {
            if (sign_stub(&buf) != 0)
                break;
#if OPENSSL_1_1_API
        } else if (strcmp(cmd, "ecdsa_sign") == 0) {
            if (ecdsa_sign_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "del_ecdsa_key") == 0) {
            if (del_ecdsa_key_stub(&buf) != 0)
                break;
#endif
        } else if (strcmp(cmd, "load_key") == 0) {
            if (load_key_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "del_rsa_key") == 0) {
            if (del_rsa_key_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "setuidgid") == 0) {
            if (setuidgid_stub(&buf) != 0)
                break;
        } else {
            warnf("unknown command:%s", cmd);
            break;
        }
        if (expbuf_write(&buf, sock_fd) != 0) {
            warnf(errno != 0 ? "write error" : "connection closed by client");
            break;
        }
        expbuf_dispose(&buf);
    }

Exit:
    expbuf_dispose(&buf);
    close(sock_fd);

    return NULL;
}